

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# full_toc.c
# Opt level: O0

cueify_msf_t cueify_full_toc_get_session_length(cueify_full_toc *t,uint8_t session)

{
  byte bVar1;
  undefined2 uVar2;
  undefined2 uVar3;
  char cVar4;
  long lVar5;
  cueify_msf_t local_30;
  char local_2b;
  byte bStack_2a;
  cueify_msf_t start;
  cueify_full_toc_private *toc;
  uint8_t session_local;
  cueify_full_toc *t_local;
  cueify_msf_t diff;
  
  t_local._5_2_ = 0;
  t_local._7_1_ = '\0';
  if (((t != (cueify_full_toc *)0x0) && (*(byte *)t <= session)) &&
     (session <= *(byte *)((long)t + 1))) {
    uVar2 = *(undefined2 *)((long)t + (ulong)session * 0x21 + 0x38b);
    t_local._7_1_ = *(byte *)((long)t + (ulong)session * 0x21 + 0x38d);
    lVar5 = (ulong)*(byte *)((long)t + (ulong)session * 0x21 + 0x388) * 9;
    uVar3 = *(undefined2 *)((long)t + lVar5 + 10);
    bVar1 = *(byte *)((long)t + lVar5 + 0xc);
    local_2b = (char)uVar3;
    t_local._5_1_ = (char)uVar2;
    t_local._5_1_ = t_local._5_1_ - local_2b;
    t_local._6_1_ = (byte)((ushort)uVar2 >> 8);
    bStack_2a = (byte)((ushort)uVar3 >> 8);
    if (t_local._6_1_ < bStack_2a) {
      t_local._6_1_ = t_local._6_1_ + 0x3c;
      t_local._5_1_ = t_local._5_1_ + -1;
    }
    cVar4 = t_local._6_1_ - bStack_2a;
    t_local._5_2_ = CONCAT11(cVar4,t_local._5_1_);
    if (t_local._7_1_ < bVar1) {
      t_local._7_1_ = t_local._7_1_ + 0x4b;
      if (cVar4 == '\0') {
        t_local._5_2_ = CONCAT11(0x3c,t_local._5_1_ + -1);
      }
      t_local._5_2_ = CONCAT11(t_local._6_1_ + -1,t_local._5_1_);
    }
    t_local._7_1_ = t_local._7_1_ - bVar1;
  }
  local_30.frm = t_local._7_1_;
  local_30.min = t_local._5_1_;
  local_30.sec = t_local._6_1_;
  return local_30;
}

Assistant:

cueify_msf_t cueify_full_toc_get_session_length(cueify_full_toc *t,
						uint8_t session) {
    cueify_full_toc_private *toc = (cueify_full_toc_private *)t;
    cueify_msf_t start, diff;

    diff.min = 0;
    diff.sec = 0;
    diff.frm = 0;

    if (toc == NULL) {
	return diff;
    } else if (session >= toc->first_session_number &&
	       session <= toc->last_session_number) {
	diff = toc->sessions[session].leadout;
	start = toc->tracks[toc->sessions[session].first_track_number].offset;
	diff.min -= start.min;
	if (diff.sec < start.sec) {
	    diff.sec += 60;
	    diff.min--;
	}
	diff.sec -= start.sec;
	if (diff.frm < start.frm) {
	    diff.frm += 75;
	    if (diff.sec == 0) {
		diff.sec += 60;
		diff.min--;
	    }
	    diff.sec--;
	}
	diff.frm -= start.frm;
	return diff;
    } else {
	return diff;
    }
}